

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_mutex> *this,double __x)

{
  pointer pfVar1;
  long in_RSI;
  double extraout_XMM0_Qa;
  memory_buf_t formatted;
  lock_guard<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  memory_buf_t *in_stack_fffffffffffffe70;
  memory_buf_t *in_stack_fffffffffffffe78;
  memory_buf_t *formatted_00;
  ansicolor_sink<spdlog::details::console_mutex> *in_stack_fffffffffffffe80;
  ansicolor_sink<spdlog::details::console_mutex> *this_00;
  allocator<char> local_139;
  memory_buf_t local_138;
  long local_10;
  ansicolor_sink<spdlog::details::console_mutex> *local_8;
  
  local_10 = in_RSI;
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe70,
             (mutex_type *)in_stack_fffffffffffffe68);
  *(undefined8 *)(local_10 + 0x28) = 0;
  *(undefined8 *)(local_10 + 0x30) = 0;
  std::allocator<char>::allocator();
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffe70,(allocator<char> *)in_stack_fffffffffffffe68);
  std::allocator<char>::~allocator(&local_139);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x28aea3);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,&local_138);
  if (((this->should_do_colors_ & 1U) == 0) ||
     (*(ulong *)(local_10 + 0x30) <= *(ulong *)(local_10 + 0x28))) {
    in_stack_fffffffffffffe70 = &local_138;
    ::fmt::v8::detail::buffer<char>::size(&in_stack_fffffffffffffe70->super_buffer<char>);
    print_range_(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (size_t)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
  }
  else {
    print_range_(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (size_t)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
    ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                  *)in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
    ::fmt::v8::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    print_ccode_(in_stack_fffffffffffffe80,(string_view_t *)in_stack_fffffffffffffe78);
    print_range_(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (size_t)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
    print_ccode_(in_stack_fffffffffffffe80,(string_view_t *)in_stack_fffffffffffffe78);
    this_00 = *(ansicolor_sink<spdlog::details::console_mutex> **)(local_10 + 0x30);
    formatted_00 = &local_138;
    ::fmt::v8::detail::buffer<char>::size(&formatted_00->super_buffer<char>);
    print_range_(this_00,formatted_00,(size_t)in_stack_fffffffffffffe70,
                 (size_t)in_stack_fffffffffffffe68);
  }
  fflush((FILE *)this->target_file_);
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
            (in_stack_fffffffffffffe70);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x28b045);
  return extraout_XMM0_Qa;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg)
{
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);
    msg.color_range_start = 0;
    msg.color_range_end = 0;
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
    {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_[static_cast<size_t>(msg.level)]);
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    }
    else // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}